

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_focus.cpp
# Opt level: O1

View * __thiscall r_exec::AutoFocusController::inject_input(AutoFocusController *this,View *input)

{
  _Object *p_Var1;
  Group *pGVar2;
  bool bVar3;
  SyncMode SVar4;
  uint32_t uVar5;
  int iVar6;
  uint32_t uVar7;
  Group *this_00;
  uint64_t uVar8;
  long lVar9;
  undefined4 extraout_var;
  long lVar10;
  _Object *p_Var11;
  undefined4 extraout_var_00;
  AutoFocusController *object;
  undefined4 extraout_var_01;
  uint64_t uVar12;
  undefined4 extraout_var_02;
  HASTController *this_01;
  undefined4 extraout_var_03;
  AutoFocusController *pAVar13;
  _Mem *p_Var14;
  undefined4 extraout_var_04;
  pointer ppGVar15;
  Controller *c;
  ulong uVar16;
  ushort uVar17;
  View *s;
  float fVar18;
  string type;
  _Object *local_88;
  _Object *local_78;
  undefined1 *local_50;
  char *local_48;
  undefined1 local_40 [16];
  
  p_Var1 = (input->super_View).object.object;
  s = input;
  this_00 = r_exec::View::get_host(input);
  pGVar2 = *(this->output_groups).
            super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar8 = (*Now)();
  SVar4 = r_exec::View::get_sync(input);
  object = this;
  switch(SVar4) {
  case SYNC_ONCE:
    ppGVar15 = (this->output_groups).
               super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->output_groups).super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppGVar15) {
      uVar17 = 1;
      uVar16 = 0;
      do {
        pGVar2 = ppGVar15[uVar16];
        pAVar13 = (AutoFocusController *)operator_new(0x100);
        r_exec::View::View((View *)pAVar13,input,true);
        ((View *)&pAVar13->super_Controller)->references[0] = (Code *)pGVar2;
        ((View *)&pAVar13->super_Controller)->references[1] = (input->super_View).references[0];
        fVar18 = (float)r_code::Atom::asFloat();
        uVar5 = Group::get_upr(this_00);
        uVar7 = Group::get_upr(pGVar2);
        lVar9 = r_code::Utils::GetGroupResilience((double)fVar18,(double)uVar5,(double)uVar7);
        r_code::Atom::Float((float)lVar9);
        r_code::Atom::operator=
                  ((Atom *)(&((View *)&pAVar13->super_Controller)->field_0x30 + 8),(Atom *)&local_50
                  );
        r_code::Atom::~Atom((Atom *)&local_50);
        p_Var14 = (_Mem *)r_code::Mem::Get();
        _Mem::inject(p_Var14,(View *)pAVar13);
        if (uVar17 == 1) {
          object = pAVar13;
        }
        uVar16 = (ulong)uVar17;
        ppGVar15 = (this->output_groups).
                   super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        uVar17 = uVar17 + 1;
      } while (uVar16 < (ulong)((long)(this->output_groups).
                                      super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar15 >>
                               3));
    }
    break;
  case SYNC_PERIODIC:
    bVar3 = _Fact::is_anti_fact((_Fact *)p_Var1);
    if (bVar3) {
      local_78 = (_Object *)AntiFact::operator_new((AntiFact *)0x150,(size_t)s);
      iVar6 = (*(((LObject *)&p_Var1->_vptr__Object)->super_Object<r_code::LObject,_r_exec::LObject>
                ).super_LObject.super_Code.super__Object._vptr__Object[9])(p_Var1,0);
      object = (AutoFocusController *)CONCAT44(extraout_var_01,iVar6);
      uVar12 = Group::get_prev_upr_time(pGVar2,uVar8);
      uVar8 = Group::get_next_upr_time(pGVar2,uVar8);
      AntiFact::AntiFact((AntiFact *)local_78,(Code *)object,uVar12,uVar8,1.0,1.0);
    }
    else {
      local_78 = (_Object *)Fact::operator_new((Fact *)0x150,(size_t)s);
      iVar6 = (*(((LObject *)&p_Var1->_vptr__Object)->super_Object<r_code::LObject,_r_exec::LObject>
                ).super_LObject.super_Code.super__Object._vptr__Object[9])(p_Var1,0);
      object = (AutoFocusController *)CONCAT44(extraout_var_04,iVar6);
      uVar12 = Group::get_prev_upr_time(pGVar2,uVar8);
      uVar8 = Group::get_next_upr_time(pGVar2,uVar8);
      Fact::Fact((Fact *)local_78,(Code *)object,uVar12,uVar8,1.0,1.0);
    }
    ppGVar15 = (this->output_groups).
               super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->output_groups).super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppGVar15) {
      uVar17 = 1;
      uVar16 = 0;
      do {
        pGVar2 = ppGVar15[uVar16];
        pAVar13 = (AutoFocusController *)operator_new(0x100);
        r_exec::View::View((View *)pAVar13,input,true);
        ((View *)&pAVar13->super_Controller)->references[0] = (Code *)pGVar2;
        ((View *)&pAVar13->super_Controller)->references[1] = (input->super_View).references[0];
        fVar18 = (float)r_code::Atom::asFloat();
        uVar5 = Group::get_upr(this_00);
        uVar7 = Group::get_upr(pGVar2);
        lVar9 = r_code::Utils::GetGroupResilience((double)fVar18,(double)uVar5,(double)uVar7);
        r_code::Atom::Float((float)lVar9);
        r_code::Atom::operator=
                  ((Atom *)(&((View *)&pAVar13->super_Controller)->field_0x30 + 8),(Atom *)&local_50
                  );
        r_code::Atom::~Atom((Atom *)&local_50);
        p_Var1 = (((View *)&pAVar13->super_Controller)->object).object;
        if (p_Var1 != local_78) {
          if (p_Var1 != (_Object *)0x0) {
            LOCK();
            (p_Var1->refCount).super___atomic_base<long>._M_i =
                 (p_Var1->refCount).super___atomic_base<long>._M_i + -1;
            UNLOCK();
            if ((p_Var1->refCount).super___atomic_base<long>._M_i < 1) {
              (**(code **)((long)(((_Fact *)&p_Var1->_vptr__Object)->super_LObject).
                                 super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
                                 super_Code.super__Object._vptr__Object + 8))();
            }
          }
          (((View *)&pAVar13->super_Controller)->object).object = local_78;
          if (local_78 != (_Object *)0x0) {
            LOCK();
            (local_78->refCount).super___atomic_base<long>._M_i =
                 (local_78->refCount).super___atomic_base<long>._M_i + 1;
            UNLOCK();
          }
        }
        p_Var14 = (_Mem *)r_code::Mem::Get();
        _Mem::inject(p_Var14,(View *)pAVar13);
        if ((uVar17 == 1) && (object = pAVar13, this->_ctpx_on == true)) {
          p_Var14 = (_Mem *)r_code::Mem::Get();
          c = (Controller *)operator_new(0xd8);
          PASTController::PASTController((PASTController *)c,this,(View *)pAVar13);
          uVar5 = Group::get_upr(pGVar2);
          lVar9 = r_code::Utils::GetBasePeriod();
          _Mem::inject_null_program(p_Var14,c,pGVar2,(ulong)uVar5 * lVar9,true);
        }
        uVar16 = (ulong)uVar17;
        ppGVar15 = (this->output_groups).
                   super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        uVar17 = uVar17 + 1;
      } while (uVar16 < (ulong)((long)(this->output_groups).
                                      super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar15 >>
                               3));
    }
    break;
  case SYNC_HOLD:
    lVar9 = r_code::Utils::GetTimeTolerance();
    bVar3 = _Fact::is_anti_fact((_Fact *)p_Var1);
    if (bVar3) {
      local_88 = (_Object *)AntiFact::operator_new((AntiFact *)0x150,(size_t)s);
      iVar6 = (*(((LObject *)&p_Var1->_vptr__Object)->super_Object<r_code::LObject,_r_exec::LObject>
                ).super_LObject.super_Code.super__Object._vptr__Object[9])(p_Var1,0);
      object = (AutoFocusController *)CONCAT44(extraout_var,iVar6);
      uVar5 = Group::get_upr(pGVar2);
      lVar10 = r_code::Utils::GetBasePeriod();
      uVar8 = lVar9 * 2 + uVar8;
      AntiFact::AntiFact((AntiFact *)local_88,(Code *)object,uVar8,lVar10 * (ulong)uVar5 + uVar8,1.0
                         ,1.0);
    }
    else {
      local_88 = (_Object *)Fact::operator_new((Fact *)0x150,(size_t)s);
      iVar6 = (*(((LObject *)&p_Var1->_vptr__Object)->super_Object<r_code::LObject,_r_exec::LObject>
                ).super_LObject.super_Code.super__Object._vptr__Object[9])(p_Var1,0);
      object = (AutoFocusController *)CONCAT44(extraout_var_02,iVar6);
      uVar5 = Group::get_upr(pGVar2);
      lVar10 = r_code::Utils::GetBasePeriod();
      uVar8 = lVar9 * 2 + uVar8;
      Fact::Fact((Fact *)local_88,(Code *)object,uVar8,lVar10 * (ulong)uVar5 + uVar8,1.0,1.0);
    }
    ppGVar15 = (this->output_groups).
               super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->output_groups).super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppGVar15) {
      uVar17 = 1;
      uVar16 = 0;
      do {
        pGVar2 = ppGVar15[uVar16];
        pAVar13 = (AutoFocusController *)operator_new(0x100);
        r_exec::View::View((View *)pAVar13,input,true);
        ((View *)&pAVar13->super_Controller)->references[0] = (Code *)pGVar2;
        ((View *)&pAVar13->super_Controller)->references[1] = (input->super_View).references[0];
        r_code::Atom::Float(0.0);
        r_code::Atom::operator=
                  ((Atom *)(&((View *)&pAVar13->super_Controller)->field_0x28 + 4),(Atom *)&local_50
                  );
        r_code::Atom::~Atom((Atom *)&local_50);
        fVar18 = (float)r_code::Atom::asFloat();
        uVar5 = Group::get_upr(this_00);
        uVar7 = Group::get_upr(pGVar2);
        lVar9 = r_code::Utils::GetGroupResilience((double)fVar18,(double)uVar5,(double)uVar7);
        r_code::Atom::Float((float)lVar9);
        r_code::Atom::operator=
                  ((Atom *)(&((View *)&pAVar13->super_Controller)->field_0x30 + 8),(Atom *)&local_50
                  );
        r_code::Atom::~Atom((Atom *)&local_50);
        p_Var11 = (((View *)&pAVar13->super_Controller)->object).object;
        if (p_Var11 != local_88) {
          if (p_Var11 != (_Object *)0x0) {
            LOCK();
            (p_Var11->refCount).super___atomic_base<long>._M_i =
                 (p_Var11->refCount).super___atomic_base<long>._M_i + -1;
            UNLOCK();
            if ((p_Var11->refCount).super___atomic_base<long>._M_i < 1) {
              (**(code **)((long)(((_Fact *)&p_Var11->_vptr__Object)->super_LObject).
                                 super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
                                 super_Code.super__Object._vptr__Object + 8))();
            }
          }
          (((View *)&pAVar13->super_Controller)->object).object = local_88;
          if (local_88 != (_Object *)0x0) {
            LOCK();
            (local_88->refCount).super___atomic_base<long>._M_i =
                 (local_88->refCount).super___atomic_base<long>._M_i + 1;
            UNLOCK();
          }
        }
        p_Var14 = (_Mem *)r_code::Mem::Get();
        _Mem::inject(p_Var14,(View *)pAVar13);
        if ((uVar17 == 1) && (object = pAVar13, this->_ctpx_on == true)) {
          p_Var14 = (_Mem *)r_code::Mem::Get();
          this_01 = (HASTController *)operator_new(0xe0);
          HASTController::HASTController(this_01,this,(View *)pAVar13,(_Fact *)p_Var1);
          uVar5 = Group::get_upr(pGVar2);
          lVar9 = r_code::Utils::GetBasePeriod();
          _Mem::inject_null_program(p_Var14,(Controller *)this_01,pGVar2,(ulong)uVar5 * lVar9,true);
        }
        uVar16 = (ulong)uVar17;
        ppGVar15 = (this->output_groups).
                   super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        uVar17 = uVar17 + 1;
      } while (uVar16 < (ulong)((long)(this->output_groups).
                                      super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar15 >>
                               3));
    }
    break;
  case SYNC_AXIOM:
    bVar3 = _Fact::is_anti_fact((_Fact *)p_Var1);
    if (bVar3) {
      p_Var11 = (_Object *)AntiFact::operator_new((AntiFact *)0x150,(size_t)s);
      iVar6 = (*(((LObject *)&p_Var1->_vptr__Object)->super_Object<r_code::LObject,_r_exec::LObject>
                ).super_LObject.super_Code.super__Object._vptr__Object[9])(p_Var1,0);
      object = (AutoFocusController *)Group::get_prev_upr_time(pGVar2,uVar8);
      uVar8 = Group::get_next_upr_time(pGVar2,uVar8);
      AntiFact::AntiFact((AntiFact *)p_Var11,(Code *)CONCAT44(extraout_var_00,iVar6),
                         (uint64_t)object,uVar8,1.0,1.0);
    }
    else {
      p_Var11 = (_Object *)Fact::operator_new((Fact *)0x150,(size_t)s);
      iVar6 = (*(((LObject *)&p_Var1->_vptr__Object)->super_Object<r_code::LObject,_r_exec::LObject>
                ).super_LObject.super_Code.super__Object._vptr__Object[9])(p_Var1,0);
      object = (AutoFocusController *)Group::get_prev_upr_time(pGVar2,uVar8);
      uVar8 = Group::get_next_upr_time(pGVar2,uVar8);
      Fact::Fact((Fact *)p_Var11,(Code *)CONCAT44(extraout_var_03,iVar6),(uint64_t)object,uVar8,1.0,
                 1.0);
    }
    ppGVar15 = (this->output_groups).
               super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->output_groups).super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppGVar15) {
      uVar17 = 1;
      uVar16 = 0;
      do {
        pGVar2 = ppGVar15[uVar16];
        pAVar13 = (AutoFocusController *)operator_new(0x100);
        r_exec::View::View((View *)pAVar13,input,true);
        ((View *)&pAVar13->super_Controller)->references[0] = (Code *)pGVar2;
        ((View *)&pAVar13->super_Controller)->references[1] = (input->super_View).references[0];
        r_code::Atom::Float(4.0);
        r_code::Atom::operator=
                  ((Atom *)(&((View *)&pAVar13->super_Controller)->field_0x28 + 4),(Atom *)&local_50
                  );
        r_code::Atom::~Atom((Atom *)&local_50);
        r_code::Atom::Float(1.0);
        r_code::Atom::operator=
                  ((Atom *)(&((View *)&pAVar13->super_Controller)->field_0x30 + 8),(Atom *)&local_50
                  );
        r_code::Atom::~Atom((Atom *)&local_50);
        p_Var1 = (((View *)&pAVar13->super_Controller)->object).object;
        if (p_Var1 != p_Var11) {
          if (p_Var1 != (_Object *)0x0) {
            LOCK();
            (p_Var1->refCount).super___atomic_base<long>._M_i =
                 (p_Var1->refCount).super___atomic_base<long>._M_i + -1;
            UNLOCK();
            if ((p_Var1->refCount).super___atomic_base<long>._M_i < 1) {
              (**(code **)((long)(((_Fact *)&p_Var1->_vptr__Object)->super_LObject).
                                 super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
                                 super_Code.super__Object._vptr__Object + 8))();
            }
          }
          (((View *)&pAVar13->super_Controller)->object).object = p_Var11;
          if (p_Var11 != (_Object *)0x0) {
            LOCK();
            (p_Var11->refCount).super___atomic_base<long>._M_i =
                 (p_Var11->refCount).super___atomic_base<long>._M_i + 1;
            UNLOCK();
          }
        }
        p_Var14 = (_Mem *)r_code::Mem::Get();
        _Mem::inject(p_Var14,(View *)pAVar13);
        if (uVar17 == 1) {
          object = pAVar13;
        }
        uVar16 = (ulong)uVar17;
        ppGVar15 = (this->output_groups).
                   super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        uVar17 = uVar17 + 1;
      } while (uVar16 < (ulong)((long)(this->output_groups).
                                      super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar15 >>
                               3));
    }
    break;
  case SYNC_ONCE_AXIOM:
    std::operator<<((ostream *)&std::cerr,"Unhandled sync once axiom");
    exit(1);
  }
  if (this->_trace_injections == true) {
    local_48 = (char *)0x0;
    local_40[0] = 0;
    local_50 = local_40;
    SVar4 = r_exec::View::get_sync(input);
    if (SVar4 < (SYNC_ONCE_AXIOM|SYNC_PERIODIC)) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_50,0,local_48,
                 (ulong)(&DAT_0019e218 + *(int *)(&DAT_0019e218 + (ulong)SVar4 * 4)));
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  return (View *)object;
}

Assistant:

inline View *AutoFocusController::inject_input(View *input)
{
    _Fact *input_fact = (_Fact *)input->object;
    Group *origin = input->get_host();
    Group *ref_group = output_groups[0];
    uint64_t now = Now();
    View *primary_view;
    _Fact *copy;

    switch (input->get_sync()) {
    case View::SYNC_ONCE: // no copy, morph res; N.B.: cmds are sync_once.
        for (uint16_t i = 0; i < output_groups.size(); ++i) {
            Group *output_group = output_groups[i];
            View *view = new View(input, true);
            view->references[0] = output_group;
            view->references[1] = input->references[0];
            view->code(VIEW_RES) = Atom::Float(Utils::GetGroupResilience(view->code(VIEW_RES).asFloat(), origin->get_upr(), output_group->get_upr()));
            _Mem::Get()->inject(view);

            if (i == 0) {
                primary_view = view;
            }
        }

        break;

    case View::SYNC_PERIODIC: // inject a copy, morph res, add a controller.
        if (input_fact->is_anti_fact()) {
            copy = new AntiFact(input_fact->get_reference(0), ref_group->get_prev_upr_time(now), ref_group->get_next_upr_time(now), 1, 1);
        } else {
            copy = new Fact(input_fact->get_reference(0), ref_group->get_prev_upr_time(now), ref_group->get_next_upr_time(now), 1, 1);
        }

        for (uint16_t i = 0; i < output_groups.size(); ++i) {
            Group *output_group = output_groups[i];
            View *view = new View(input, true);
            view->references[0] = output_group;
            view->references[1] = input->references[0];
            view->code(VIEW_RES) = Atom::Float(Utils::GetGroupResilience(view->code(VIEW_RES).asFloat(), origin->get_upr(), output_group->get_upr()));
            view->object = copy;
            _Mem::Get()->inject(view);

            if (i == 0) {
                primary_view = view;

                if (_ctpx_on) {
                    _Mem::Get()->inject_null_program(new PASTController(this, view), output_group, output_group->get_upr()*Utils::GetBasePeriod(), true);
                }
            }
        }

        break;

    case View::SYNC_HOLD: { // inject a copy, add a controller, sync_once, morph res, after=now+time_tolerance (de-sync as it can have the same effect as a cmd), before=now+output_grp.upr+time_tolerance.
        uint64_t offset = 2 * Utils::GetTimeTolerance();

        if (input_fact->is_anti_fact()) {
            copy = new AntiFact(input_fact->get_reference(0), now + offset, now + offset + ref_group->get_upr()*Utils::GetBasePeriod(), 1, 1);
        } else {
            copy = new Fact(input_fact->get_reference(0), now + offset, now + offset + ref_group->get_upr()*Utils::GetBasePeriod(), 1, 1);
        }

        for (uint16_t i = 0; i < output_groups.size(); ++i) {
            Group *output_group = output_groups[i];
            View *view = new View(input, true);
            view->references[0] = output_group;
            view->references[1] = input->references[0];
            view->code(VIEW_SYNC) = Atom::Float(View::SYNC_ONCE);
            view->code(VIEW_RES) = Atom::Float(Utils::GetGroupResilience(view->code(VIEW_RES).asFloat(), origin->get_upr(), output_group->get_upr()));
            view->object = copy;
            _Mem::Get()->inject(view);

            if (i == 0) {
                primary_view = view;

                if (_ctpx_on) {
                    _Mem::Get()->inject_null_program(new HASTController(this, view, input_fact), output_group, output_group->get_upr()*Utils::GetBasePeriod(), true);
                }
            }
        }

        break;
    }

    case View::SYNC_AXIOM: // inject a copy, sync_once, res=1, fact.before=next output_grp upr.
        if (input_fact->is_anti_fact()) {
            copy = new AntiFact(input_fact->get_reference(0), ref_group->get_prev_upr_time(now), ref_group->get_next_upr_time(now), 1, 1);
        } else {
            copy = new Fact(input_fact->get_reference(0), ref_group->get_prev_upr_time(now), ref_group->get_next_upr_time(now), 1, 1);
        }

        for (uint16_t i = 0; i < output_groups.size(); ++i) {
            Group *output_group = output_groups[i];
            View *view = new View(input, true);
            view->references[0] = output_group;
            view->references[1] = input->references[0];
            view->code(VIEW_SYNC) = Atom::Float(View::SYNC_ONCE_AXIOM);
            view->code(VIEW_RES) = Atom::Float(1);
            view->object = copy;
            _Mem::Get()->inject(view);

            if (i == 0) {
                primary_view = view;
            }
        }

        break;
    case View::SYNC_ONCE_AXIOM:
        std::cerr << "Unhandled sync once axiom";
        exit(1);
        break;
    }

    if (_trace_injections) {
        std::string type;

        switch (input->get_sync()) {
        case View::SYNC_HOLD:
            type = "(hold)";
            break;

        case View::SYNC_ONCE:
            type = "(once)";
            break;

        case View::SYNC_PERIODIC:
            type = "(periodic)";
            break;

        case View::SYNC_AXIOM:
            type = "(axiom)";
            break;

        case View::SYNC_ONCE_AXIOM:
            type = "(once axiom)";
            break;
        }

        //    ::debug("auto_focus") << Utils::RelativeTime(Now()) << "A/F ->" << input->object->get_oid() << "|" << primary_view->object->get_oid() << type;
    }

    return primary_view;
}